

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O3

int mpc_test_pass(mpc_parser_t *p,char *s,void *d,_func_int_void_ptr_void_ptr *tester,
                 mpc_dtor_t destructor,_func_void_void_ptr *printer)

{
  int iVar1;
  mpc_input_t *i;
  mpc_result_t r;
  mpc_result_t local_40;
  mpc_dtor_t local_38;
  
  local_38 = destructor;
  i = mpc_input_new_string("<test>",s);
  iVar1 = mpc_parse_input(i,p,&local_40);
  mpc_input_delete(i);
  if (iVar1 == 0) {
    mpc_err_print(local_40.error);
    mpc_err_delete(local_40.error);
    iVar1 = 0;
  }
  else {
    iVar1 = (*tester)(local_40.error,d);
    if (iVar1 == 0) {
      iVar1 = 0;
      printf("Got ");
      (*printer)(local_40.error);
      putchar(10);
      printf("Expected ");
      (*printer)(d);
      putchar(10);
      (*local_38)(local_40.error);
    }
    else {
      (*local_38)(local_40.error);
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int mpc_test_pass(mpc_parser_t *p, const char *s, const void *d,
  int(*tester)(const void*, const void*),
  mpc_dtor_t destructor,
  void(*printer)(const void*)) {

  mpc_result_t r;
  if (mpc_parse("<test>", s, p, &r)) {

    if (tester(r.output, d)) {
      destructor(r.output);
      return 1;
    } else {
      printf("Got "); printer(r.output); printf("\n");
      printf("Expected "); printer(d); printf("\n");
      destructor(r.output);
      return 0;
    }

  } else {
    mpc_err_print(r.error);
    mpc_err_delete(r.error);
    return 0;

  }

}